

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void resetCursor(RtreeCursor *pCsr)

{
  Rtree *pRtree;
  void *p;
  sqlite3_stmt *psVar1;
  long lVar2;
  int i;
  long lVar3;
  
  pRtree = (Rtree *)(pCsr->base).pVtab;
  if (pCsr->aConstraint != (RtreeConstraint *)0x0) {
    lVar2 = 0x10;
    for (lVar3 = 0; lVar3 < pCsr->nConstraint; lVar3 = lVar3 + 1) {
      p = *(void **)((long)&pCsr->aConstraint->iCoord + lVar2);
      if (p != (void *)0x0) {
        if (*(code **)((long)p + 0x20) != (code *)0x0) {
          (**(code **)((long)p + 0x20))(*(undefined8 *)((long)p + 0x18));
        }
        sqlite3_free(p);
      }
      lVar2 = lVar2 + 0x18;
    }
    sqlite3_free(pCsr->aConstraint);
    pCsr->aConstraint = (RtreeConstraint *)0x0;
  }
  for (lVar2 = 0xb; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    nodeRelease(pRtree,pCsr->aNode[lVar2 + -0xb]);
  }
  sqlite3_free(pCsr->aPoint);
  psVar1 = pCsr->pReadAux;
  memset(pCsr,0,0x128);
  (pCsr->base).pVtab = (sqlite3_vtab *)pRtree;
  pCsr->pReadAux = psVar1;
  return;
}

Assistant:

static void resetCursor(RtreeCursor *pCsr){
  Rtree *pRtree = (Rtree *)(pCsr->base.pVtab);
  int ii;
  sqlite3_stmt *pStmt;
  if( pCsr->aConstraint ){
    int i;                        /* Used to iterate through constraint array */
    for(i=0; i<pCsr->nConstraint; i++){
      sqlite3_rtree_query_info *pInfo = pCsr->aConstraint[i].pInfo;
      if( pInfo ){
        if( pInfo->xDelUser ) pInfo->xDelUser(pInfo->pUser);
        sqlite3_free(pInfo);
      }
    }
    sqlite3_free(pCsr->aConstraint);
    pCsr->aConstraint = 0;
  }
  for(ii=0; ii<RTREE_CACHE_SZ; ii++) nodeRelease(pRtree, pCsr->aNode[ii]);
  sqlite3_free(pCsr->aPoint);
  pStmt = pCsr->pReadAux;
  memset(pCsr, 0, sizeof(RtreeCursor));
  pCsr->base.pVtab = (sqlite3_vtab*)pRtree;
  pCsr->pReadAux = pStmt;

}